

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O2

void __thiscall WorkerThread::setAffinity(WorkerThread *this,uint idx)

{
  int iVar1;
  logic_error *this_00;
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  cpu_set_t cpuset;
  
  cpuset.__bits[0xe] = 0;
  cpuset.__bits[0xf] = 0;
  cpuset.__bits[0xc] = 0;
  cpuset.__bits[0xd] = 0;
  cpuset.__bits[10] = 0;
  cpuset.__bits[0xb] = 0;
  cpuset.__bits[8] = 0;
  cpuset.__bits[9] = 0;
  cpuset.__bits[6] = 0;
  cpuset.__bits[7] = 0;
  cpuset.__bits[4] = 0;
  cpuset.__bits[5] = 0;
  cpuset.__bits[2] = 0;
  cpuset.__bits[3] = 0;
  cpuset.__bits[0] = 0;
  cpuset.__bits[1] = 0;
  if (idx < 0x400) {
    cpuset.__bits[idx >> 6] = cpuset.__bits[idx >> 6] | 1L << ((byte)idx & 0x3f);
  }
  iVar1 = pthread_setaffinity_np((this->workerThread)._M_id._M_thread,0x80,(cpu_set_t *)&cpuset);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_d8,idx);
  std::operator+(&local_b8,"Error setting affinity to processor  ",&sStack_d8);
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void WorkerThread::setAffinity (unsigned int idx) {
	cpu_set_t cpuset;
	CPU_ZERO (&cpuset);
	CPU_SET (idx, &cpuset);
	
	if (pthread_setaffinity_np (workerThread.native_handle(), sizeof(cpu_set_t), &cpuset) != 0) {
		throw std::logic_error ("Error setting affinity to processor  " + std::to_string(idx));
	}
}